

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O1

ER __thiscall slang::ast::Statement::eval(Statement *this,EvalContext *context)

{
  ER EVar1;
  
  EVar1 = (*(code *)(&DAT_00524f98 + *(int *)(&DAT_00524f98 + (ulong)this->kind * 4)))
                    (this,context,&DAT_00524f98 + *(int *)(&DAT_00524f98 + (ulong)this->kind * 4));
  return EVar1;
}

Assistant:

ER Statement::eval(EvalContext& context) const {
    EvalVisitor visitor;
    return visit(visitor, context);
}